

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O0

DdNode * Extra_bddSpaceFromMatrixNeg(DdManager *dd,DdNode *zA)

{
  DdNode *pDVar1;
  DdNode *bRes;
  DdNode *zA_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraBddSpaceFromMatrixNeg(dd,zA);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_bddSpaceFromMatrixNeg( DdManager * dd, DdNode * zA )
{
    DdNode * bRes;
    do {
        dd->reordered = 0;
        bRes = extraBddSpaceFromMatrixNeg( dd, zA );
    } while (dd->reordered == 1);
    return bRes;
}